

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void luaG_errormsg(lua_State *L)

{
  StkId pTVar1;
  StkId pTVar2;
  Value *pVVar3;
  TValue *io1_1;
  TValue *io2_1;
  TValue *io1;
  TValue *io2;
  StkId errfunc;
  lua_State *L_local;
  
  if (L->errfunc != 0) {
    pVVar3 = (Value *)((long)&L->stack->value_ + L->errfunc);
    if ((pVVar3[1].b & 0xfU) != 6) {
      luaD_throw(L,6);
    }
    pTVar1 = L->top;
    pTVar2 = L->top;
    pTVar2->value_ = pTVar1[-1].value_;
    pTVar2->tt_ = pTVar1[-1].tt_;
    pTVar1 = L->top;
    pTVar1[-1].value_ = *pVVar3;
    pTVar1[-1].tt_ = pVVar3[1].b;
    L->top = L->top + 1;
    luaD_call(L,L->top + -2,1,0);
  }
  luaD_throw(L,2);
}

Assistant:

l_noret luaG_errormsg (lua_State *L) {
  if (L->errfunc != 0) {  /* is there an error handling function? */
    StkId errfunc = restorestack(L, L->errfunc);
    if (!ttisfunction(errfunc)) luaD_throw(L, LUA_ERRERR);
    setobjs2s(L, L->top, L->top - 1);  /* move argument */
    setobjs2s(L, L->top - 1, errfunc);  /* push function */
    L->top++;
    luaD_call(L, L->top - 2, 1, 0);  /* call it */
  }
  luaD_throw(L, LUA_ERRRUN);
}